

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int copyEntityTable(XML_Parser oldParser,HASH_TABLE *newTable,STRING_POOL *newPool,
                   HASH_TABLE *oldTable)

{
  XML_Char XVar1;
  XML_Bool XVar2;
  NAMED *pNVar3;
  XML_Char *pXVar4;
  NAMED *pNVar5;
  int iVar6;
  KEY pXVar7;
  KEY local_60;
  XML_Char *local_58;
  HASH_TABLE_ITER iter;
  
  iter.p = oldTable->v;
  if (iter.p == (NAMED **)0x0) {
    iter.end = (NAMED **)0x0;
  }
  else {
    iter.end = iter.p + oldTable->size;
  }
  local_60 = (KEY)0x0;
  local_58 = (XML_Char *)0x0;
  do {
    pNVar3 = hashTableIterNext(&iter);
    if (pNVar3 == (NAMED *)0x0) {
      return 1;
    }
    pXVar4 = poolCopyString(newPool,pNVar3->name);
    if (pXVar4 == (XML_Char *)0x0) {
      return 0;
    }
    pNVar5 = lookup(oldParser,newTable,pXVar4,0x40);
    if (pNVar5 == (NAMED *)0x0) {
      return 0;
    }
    if (pNVar3[3].name == (XML_Char *)0x0) {
      pXVar7 = pNVar3[1].name;
      iVar6 = *(int *)&pNVar3[2].name;
      if ((newPool->ptr == (XML_Char *)0x0) && (XVar2 = poolGrow(newPool), XVar2 == '\0')) {
        return 0;
      }
      for (; 0 < iVar6; iVar6 = iVar6 + -1) {
        pXVar4 = newPool->ptr;
        if (pXVar4 == newPool->end) {
          XVar2 = poolGrow(newPool);
          if (XVar2 == '\0') {
            return 0;
          }
          pXVar4 = newPool->ptr;
        }
        XVar1 = *pXVar7;
        newPool->ptr = pXVar4 + 1;
        *pXVar4 = XVar1;
        pXVar7 = pXVar7 + 1;
      }
      pXVar7 = newPool->start;
      newPool->start = newPool->ptr;
      if (pXVar7 == (KEY)0x0) {
        return 0;
      }
      pNVar5[1].name = pXVar7;
      *(undefined4 *)&pNVar5[2].name = *(undefined4 *)&pNVar3[2].name;
    }
    else {
      pXVar4 = poolCopyString(newPool,pNVar3[3].name);
      if (pXVar4 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar5[3].name = pXVar4;
      pXVar4 = pNVar3[4].name;
      if (pXVar4 != (XML_Char *)0x0) {
        if ((pXVar4 != local_58) &&
           (local_60 = poolCopyString(newPool,pXVar4), local_58 = pXVar4,
           local_60 == (XML_Char *)0x0)) {
          return 0;
        }
        pNVar5[4].name = local_60;
      }
      if (pNVar3[5].name != (XML_Char *)0x0) {
        pXVar4 = poolCopyString(newPool,pNVar3[5].name);
        if (pXVar4 == (XML_Char *)0x0) {
          return 0;
        }
        pNVar5[5].name = pXVar4;
      }
    }
    if (pNVar3[6].name != (XML_Char *)0x0) {
      pXVar4 = poolCopyString(newPool,pNVar3[6].name);
      if (pXVar4 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar5[6].name = pXVar4;
    }
    *(undefined1 *)((long)&pNVar5[7].name + 1) = *(undefined1 *)((long)&pNVar3[7].name + 1);
    *(undefined1 *)((long)&pNVar5[7].name + 2) = *(undefined1 *)((long)&pNVar3[7].name + 2);
  } while( true );
}

Assistant:

static int
copyEntityTable(XML_Parser oldParser, HASH_TABLE *newTable,
                STRING_POOL *newPool, const HASH_TABLE *oldTable) {
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = NULL;
  const XML_Char *cachedNewBase = NULL;

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (! oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (! name)
      return 0;
    newE = (ENTITY *)lookup(oldParser, newTable, name, sizeof(ENTITY));
    if (! newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (! tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (! tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
      if (oldE->publicId) {
        tem = poolCopyString(newPool, oldE->publicId);
        if (! tem)
          return 0;
        newE->publicId = tem;
      }
    } else {
      const XML_Char *tem
          = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (! tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (! tem)
        return 0;
      newE->notation = tem;
    }
    newE->is_param = oldE->is_param;
    newE->is_internal = oldE->is_internal;
  }
  return 1;
}